

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkEnum
          (DescriptorBuilder *this,EnumDescriptor *enum_type,EnumDescriptorProto *proto)

{
  long lVar1;
  int iVar2;
  EnumOptions *pEVar3;
  EnumValueOptions *pEVar4;
  long lVar5;
  long lVar6;
  
  if (*(long *)(enum_type + 0x20) == 0) {
    pEVar3 = EnumOptions::default_instance();
    *(EnumOptions **)(enum_type + 0x20) = pEVar3;
  }
  iVar2 = *(int *)(enum_type + 0x2c);
  if (0 < iVar2) {
    lVar5 = 0x20;
    lVar6 = 0;
    do {
      lVar1 = *(long *)(enum_type + 0x30);
      if (*(long *)(lVar1 + lVar5) == 0) {
        pEVar4 = EnumValueOptions::default_instance();
        *(EnumValueOptions **)(lVar1 + lVar5) = pEVar4;
        iVar2 = *(int *)(enum_type + 0x2c);
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x28;
    } while (lVar6 < iVar2);
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkEnum(EnumDescriptor* enum_type,
                                      const EnumDescriptorProto& proto) {
  if (enum_type->options_ == nullptr) {
    enum_type->options_ = &EnumOptions::default_instance();
  }

  for (int i = 0; i < enum_type->value_count(); i++) {
    CrossLinkEnumValue(&enum_type->values_[i], proto.value(i));
  }
}